

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

bool __thiscall cmMakefile::ProcessBuildsystemFile(cmMakefile *this,char *filename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  string curSrc;
  cmListFile listFile;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string local_68;
  cmListFile local_48;
  
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,&local_68,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = cmState::Snapshot::GetCurrentSourceDirectory(&this->StateSnapshot);
  std::__cxx11::string::string((string *)&local_68,pcVar5,(allocator *)&local_88);
  std::__cxx11::string::string((string *)&local_88,filename,(allocator *)&local_48);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &this->ListFileStack,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmake::GetHomeDirectory(this->LocalGenerator->GlobalGenerator->CMakeInstance);
  iVar4 = std::__cxx11::string::compare((char *)&local_68);
  bVar2 = cmListFile::ParseFile(&local_48,filename,iVar4 == 0,this);
  if (bVar2) {
    PushPolicyBarrier(this);
    std::__cxx11::string::string((string *)&local_88,filename,&local_89);
    ReadListFile(this,&local_48,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    bVar3 = true;
    if (cmSystemTools::s_FatalErrorOccured == false) {
      bVar3 = cmSystemTools::GetInterruptFlag();
    }
    PopPolicyBarrier(this,(bool)(bVar3 ^ 1));
    EnforceDirectoryLevelRules(this);
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&local_48.Functions)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmMakefile::ProcessBuildsystemFile(const char* filename)
{
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", filename);
  std::string curSrc = this->GetCurrentSourceDirectory();

  this->ListFileStack.push_back(filename);

  cmListFile listFile;
  if (!listFile.ParseFile(filename, curSrc == this->GetHomeDirectory(), this))
    {
    return false;
    }

  this->PushPolicyBarrier();
  this->ReadListFile(listFile, filename);
  this->PopPolicyBarrier(!cmSystemTools::GetFatalErrorOccured());
  this->EnforceDirectoryLevelRules();
  return true;
}